

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O0

int __thiscall zmq::ctx_t::shutdown(ctx_t *this,int __fd,int __how)

{
  bool bVar1;
  size_type sVar2;
  size_type size;
  size_type i;
  scoped_lock_t locker;
  mutex_t *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  size_type local_18;
  
  scoped_lock_t::scoped_lock_t
            ((scoped_lock_t *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  if (((this->_terminating & 1U) == 0) && (this->_terminating = true, (this->_starting & 1U) == 0))
  {
    local_18 = 0;
    sVar2 = array_t<zmq::socket_base_t,_0>::size((array_t<zmq::socket_base_t,_0> *)0x1d4889);
    for (; local_18 != sVar2; local_18 = local_18 + 1) {
      array_t<zmq::socket_base_t,_0>::operator[]
                ((array_t<zmq::socket_base_t,_0> *)
                 CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 (size_type)in_stack_ffffffffffffffa8);
      socket_base_t::stop((socket_base_t *)0x1d48d0);
    }
    bVar1 = array_t<zmq::socket_base_t,_0>::empty((array_t<zmq::socket_base_t,_0> *)0x1d490f);
    if (bVar1) {
      reaper_t::stop((reaper_t *)CONCAT17(bVar1,in_stack_ffffffffffffffb0));
    }
  }
  scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x1d4942);
  return 0;
}

Assistant:

int zmq::ctx_t::shutdown ()
{
    scoped_lock_t locker (_slot_sync);

    if (!_terminating) {
        _terminating = true;

        if (!_starting) {
            //  Send stop command to sockets so that any blocking calls
            //  can be interrupted. If there are no sockets we can ask reaper
            //  thread to stop.
            for (sockets_t::size_type i = 0, size = _sockets.size (); i != size;
                 i++) {
                _sockets[i]->stop ();
            }
            if (_sockets.empty ())
                _reaper->stop ();
        }
    }

    return 0;
}